

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall duckdb_re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  undefined1 auVar1 [13];
  uint p;
  undefined8 uVar2;
  Compiler *this_00;
  Inst *this_01;
  uint uVar3;
  Frag FVar4;
  Frag a_00;
  uint uStack_48;
  undefined4 uStack_44;
  Frag a_local;
  
  if ((a._8_8_ >> 0x20 & 1) == 0) {
    this_00 = this;
    p = AllocInst(this,1);
    if (-1 < (int)p) {
      this_01 = (this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + p;
      uVar3 = p * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(this_01,0,a.begin);
      }
      else {
        Prog::Inst::InitAlt(this_01,a.begin,0);
        uVar3 = uVar3 | 1;
      }
      PatchList::Patch((this->inst_).ptr_._M_t.
                       super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                       .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl,a.end,p)
      ;
      uStack_48 = uVar3 / 1;
      uStack_44 = CONCAT31(uStack_44._1_3_,1);
      uVar2 = CONCAT44(uVar3,p);
      goto LAB_01b19fe7;
    }
    FVar4 = NoMatch(this_00);
    auVar1 = FVar4._0_13_;
  }
  else {
    FVar4 = Plus(this,a,nongreedy);
    a_00._8_8_ = FVar4._8_8_ & 0xffffffffff;
    a_00.begin = (int)FVar4._0_8_;
    a_00.end.head = (int)((ulong)FVar4._0_8_ >> 0x20);
    FVar4 = Quest(this,a_00,nongreedy);
    auVar1 = FVar4._0_13_;
  }
  uVar2 = auVar1._0_8_;
  uStack_48 = auVar1._8_4_;
  uStack_44 = CONCAT31(uStack_44._1_3_,auVar1[0xc]);
LAB_01b19fe7:
  FVar4._12_4_ = uStack_44;
  FVar4.end.tail = uStack_48;
  FVar4.begin = (int)uVar2;
  FVar4.end.head = (int)((ulong)uVar2 >> 0x20);
  return FVar4;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  // When the subexpression is nullable, one Alt isn't enough to guarantee
  // correct priority ordering within the transitive closure. The simplest
  // solution is to handle it as (a+)? instead, which adds the second Alt.
  if (a.nullable)
    return Quest(Plus(a, nongreedy), nongreedy);

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(id, pl, true);
}